

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void __thiscall FIX::double_conversion::StringBuilder::TrimTrailingZeros(StringBuilder *this)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int n;
  long lVar15;
  ulong uVar16;
  
  if ((this->position_ < 0) || ((this->buffer_).length_ <= this->position_)) {
    __assert_fail("!is_finalized() && position_ < buffer_.length()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0x120,"void FIX::double_conversion::StringBuilder::TrimTrailingZeros()");
  }
  uVar7 = (ulong)(uint)this->position_;
  if (0 < this->position_) {
    uVar16 = 0;
    do {
      iVar2 = (this->buffer_).length_;
      if ((long)iVar2 <= (long)uVar16) {
LAB_0016cca0:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
      }
      pcVar3 = (this->buffer_).start_;
      if (pcVar3[uVar16] == '.') {
        iVar6 = (int)uVar7;
        uVar9 = iVar6 - 1;
        uVar8 = (ulong)uVar9;
        if ((int)uVar16 < (int)uVar9) {
          uVar8 = uVar16 & 0xffffffff;
        }
        pbVar11 = (byte *)(pcVar3 + uVar9);
        lVar12 = uVar7 << 0x20;
        n = 0;
        iVar14 = 0;
        do {
          iVar13 = iVar14;
          lVar12 = lVar12 + -0x100000000;
          if (lVar12 >> 0x20 <= (long)uVar16) goto LAB_0016cc1f;
          if ((iVar6 + iVar13 < 1) || (iVar2 < iVar6)) goto LAB_0016cca0;
          bVar1 = *pbVar11;
          iVar14 = iVar13 + -1;
          pbVar11 = pbVar11 + -1;
        } while ((bVar1 | 0x20) != 0x65);
        uVar8 = (ulong)(uint)(iVar6 + iVar14);
        n = -iVar14;
        this->position_ = iVar6 + iVar14;
LAB_0016cc1f:
        uVar9 = this->position_;
        lVar12 = (long)(int)uVar9;
        bVar4 = 0 < lVar12;
        if (0 < lVar12) {
          lVar12 = lVar12 + 1;
          uVar10 = uVar9;
          do {
            uVar10 = uVar10 - 1;
            if (iVar2 < (int)uVar9) goto LAB_0016cca0;
            if (pcVar3[lVar12 + -2] != '0') {
              if ((bVar4) && (pcVar3[uVar10] == '.')) {
                this->position_ = uVar10;
              }
              break;
            }
            this->position_ = uVar10;
            lVar15 = lVar12 + -1;
            lVar5 = lVar12 + -3;
            bVar4 = 1 < lVar15;
            lVar12 = lVar15;
          } while (SBORROW8(lVar15,2) == lVar5 < 0);
        }
        if (0 < n) {
          if ((iVar6 + iVar13 < 1) || (iVar2 < iVar6 + iVar13)) goto LAB_0016cca0;
          AddSubstring(this,pcVar3 + uVar8,n);
        }
      }
      uVar16 = uVar16 + 1;
      uVar7 = (ulong)this->position_;
    } while ((long)uVar16 < (long)uVar7);
  }
  return;
}

Assistant:

bool is_finalized() const { return position_ < 0; }